

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_board(sparse_array_n<bool,_2,_std::allocator<bool>_> *board,int *m,int *n)

{
  bool *pbVar1;
  char *pcVar2;
  uint d0;
  uint uVar3;
  ulong uVar4;
  
  if (*m != 0) {
    d0 = 0;
    do {
      if (*n != 0) {
        uVar4 = 0;
        do {
          pbVar1 = sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::operator()(board,d0,uVar4);
          pcVar2 = "X";
          if (*pbVar1 == false) {
            pcVar2 = " ";
          }
          printf("\x1b[%d;%dH%s\n",(ulong)d0,uVar4,pcVar2);
          uVar3 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar3;
        } while (uVar3 < (uint)*n);
      }
      d0 = d0 + 1;
    } while (d0 < (uint)*m);
  }
  return;
}

Assistant:

void print_board(const sisl::sparse_array_n<bool, 2> &board, const int &m, const int &n) {
	for(uint i = 0; i < m; i++)
		for(uint j = 0; j < n; j++) {
			print_at(
				i,j,
				board(i,j) ? "X" : " "
			);
		}
}